

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O3

void __thiscall
snappy::SnappyDecompressor::DecompressAllTags<snappy::SnappyIOVecWriter>
          (SnappyDecompressor *this,SnappyIOVecWriter *writer)

{
  byte bVar1;
  ushort uVar2;
  size_t sVar3;
  void *pvVar4;
  iovec *piVar5;
  bool bVar6;
  undefined4 extraout_var;
  byte *pbVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  size_t sVar12;
  uint *__src;
  byte *pbVar13;
  ulong __n;
  uint *puVar14;
  ulong uVar15;
  ulong uVar16;
  size_t n;
  ulong local_38;
  
  pbVar13 = (byte *)this->ip_;
  if ((long)this->ip_limit_ - (long)pbVar13 < 5) {
    bVar6 = RefillTag(this);
    if (!bVar6) {
      return;
    }
    pbVar13 = (byte *)this->ip_;
  }
LAB_00150881:
  do {
    __src = (uint *)(pbVar13 + 1);
    bVar1 = *pbVar13;
    if ((bVar1 & 3) == 0) {
      uVar16 = (ulong)(bVar1 >> 2) + 1;
      pbVar7 = (byte *)this->ip_limit_;
      uVar15 = (long)pbVar7 - (long)__src;
      sVar12 = writer->total_written_;
      uVar11 = writer->output_limit_;
      if ((uVar11 - sVar12 < 0x10 || uVar15 < 0x15) || 0x3f < bVar1) {
        if (0xec < bVar1) {
          puVar14 = (uint *)((long)__src + ((ulong)(bVar1 >> 2) - 0x3b));
          uVar16 = (ulong)((*(uint *)(char_table + uVar16 * 4 + 0x110) & *__src) + 1);
          uVar15 = (long)pbVar7 - (long)puVar14;
          __src = puVar14;
        }
      }
      else {
        sVar3 = writer->curr_iov_written_;
        if (0xf < writer->output_iov_[writer->curr_iov_index_].iov_len - sVar3) {
          pvVar4 = writer->output_iov_[writer->curr_iov_index_].iov_base;
          *(undefined8 *)((long)pvVar4 + sVar3) = *(undefined8 *)(pbVar13 + 1);
          *(undefined8 *)((long)pvVar4 + sVar3 + 8) = *(undefined8 *)(pbVar13 + 9);
          writer->curr_iov_written_ = uVar16 + writer->curr_iov_written_;
          writer->total_written_ = uVar16 + writer->total_written_;
          pbVar13 = (byte *)((long)__src + uVar16);
          goto LAB_00150881;
        }
      }
      if (uVar15 < uVar16) {
        do {
          if (writer->output_limit_ < writer->total_written_ + uVar15) {
            return;
          }
          if (uVar15 != 0) {
            sVar12 = writer->curr_iov_written_;
            uVar11 = uVar15;
            do {
              piVar5 = writer->output_iov_;
              uVar9 = (ulong)writer->curr_iov_index_;
              uVar10 = piVar5[uVar9].iov_len;
              if (uVar10 < sVar12) goto LAB_00150b99;
              if (uVar10 <= sVar12) {
                iVar8 = writer->curr_iov_index_ + 1;
                uVar9 = (ulong)iVar8;
                if (writer->output_iov_count_ <= uVar9) {
                  return;
                }
                writer->curr_iov_written_ = 0;
                writer->curr_iov_index_ = iVar8;
                uVar10 = piVar5[uVar9].iov_len;
                sVar12 = 0;
              }
              __n = uVar10 - sVar12;
              if (uVar11 <= uVar10 - sVar12) {
                __n = uVar11;
              }
              memcpy((void *)(sVar12 + (long)piVar5[uVar9].iov_base),__src,__n);
              sVar12 = writer->curr_iov_written_ + __n;
              writer->curr_iov_written_ = sVar12;
              writer->total_written_ = writer->total_written_ + __n;
              __src = (uint *)((long)__src + __n);
              uVar11 = uVar11 - __n;
            } while (uVar11 != 0);
          }
          (*this->reader_->_vptr_Source[4])(this->reader_,(ulong)this->peeked_);
          iVar8 = (*this->reader_->_vptr_Source[3])(this->reader_,&local_38);
          __src = (uint *)CONCAT44(extraout_var,iVar8);
          this->peeked_ = (uint32)local_38;
          if (local_38 == 0) {
            return;
          }
          uVar16 = uVar16 - uVar15;
          pbVar7 = (byte *)((long)__src + local_38);
          this->ip_limit_ = (char *)pbVar7;
          uVar15 = local_38;
        } while (local_38 < uVar16);
        sVar12 = writer->total_written_;
        uVar11 = writer->output_limit_;
      }
      if (uVar11 < sVar12 + uVar16) {
        return;
      }
      if (uVar16 != 0) {
        sVar12 = writer->curr_iov_written_;
        puVar14 = __src;
        uVar11 = uVar16;
        do {
          piVar5 = writer->output_iov_;
          uVar10 = (ulong)writer->curr_iov_index_;
          uVar15 = piVar5[uVar10].iov_len;
          if (uVar15 < sVar12) {
LAB_00150b99:
            __assert_fail("curr_iov_written_ <= output_iov_[curr_iov_index_].iov_len",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/snappy/snappy.cc"
                          ,0x3f8,"bool snappy::SnappyIOVecWriter::Append(const char *, size_t)");
          }
          if (uVar15 <= sVar12) {
            iVar8 = writer->curr_iov_index_ + 1;
            uVar10 = (ulong)iVar8;
            if (writer->output_iov_count_ <= uVar10) {
              return;
            }
            writer->curr_iov_written_ = 0;
            writer->curr_iov_index_ = iVar8;
            uVar15 = piVar5[uVar10].iov_len;
            sVar12 = 0;
          }
          uVar9 = uVar15 - sVar12;
          if (uVar11 <= uVar15 - sVar12) {
            uVar9 = uVar11;
          }
          memcpy((void *)(sVar12 + (long)piVar5[uVar10].iov_base),puVar14,uVar9);
          sVar12 = writer->curr_iov_written_ + uVar9;
          writer->curr_iov_written_ = sVar12;
          writer->total_written_ = writer->total_written_ + uVar9;
          puVar14 = (uint *)((long)puVar14 + uVar9);
          uVar11 = uVar11 - uVar9;
        } while (uVar11 != 0);
        pbVar7 = (byte *)this->ip_limit_;
      }
      pbVar13 = (byte *)((long)__src + uVar16);
      if (4 < (long)pbVar7 - (long)pbVar13) goto LAB_00150881;
      this->ip_ = (char *)pbVar13;
    }
    else {
      uVar2 = *(ushort *)(char_table + (ulong)bVar1 * 2);
      bVar6 = SnappyIOVecWriter::AppendFromSelf
                        (writer,(ulong)((uVar2 & 0x700) +
                                       (*(uint *)(wordmask + (ulong)(uVar2 >> 0xb) * 4) & *__src)),
                         (ulong)uVar2 & 0xff);
      if (!bVar6) {
        return;
      }
      pbVar13 = (byte *)((long)__src + (ulong)(uVar2 >> 0xb));
      if (4 < (long)this->ip_limit_ - (long)pbVar13) goto LAB_00150881;
      this->ip_ = (char *)pbVar13;
    }
    bVar6 = RefillTag(this);
    pbVar13 = (byte *)this->ip_;
    if (!bVar6) {
      return;
    }
  } while( true );
}

Assistant:

void DecompressAllTags(Writer* writer) {
    const char* ip = ip_;

    // We could have put this refill fragment only at the beginning of the loop.
    // However, duplicating it at the end of each branch gives the compiler more
    // scope to optimize the <ip_limit_ - ip> expression based on the local
    // context, which overall increases speed.
    #define MAYBE_REFILL() \
        if (ip_limit_ - ip < kMaximumTagLength) { \
          ip_ = ip; \
          if (!RefillTag()) return; \
          ip = ip_; \
        }

    MAYBE_REFILL();
    for ( ;; ) {
      const unsigned char c = *(reinterpret_cast<const unsigned char*>(ip++));

      if ((c & 0x3) == LITERAL) {
        size_t literal_length = (c >> 2) + 1u;
        if (writer->TryFastAppend(ip, ip_limit_ - ip, literal_length)) {
          assert(literal_length < 61);
          ip += literal_length;
          // NOTE(user): There is no MAYBE_REFILL() here, as TryFastAppend()
          // will not return true unless there's already at least five spare
          // bytes in addition to the literal.
          continue;
        }
        if (PREDICT_FALSE(literal_length >= 61)) {
          // Long literal.
          const size_t literal_length_length = literal_length - 60;
          literal_length =
              (LittleEndian::Load32(ip) & wordmask[literal_length_length]) + 1;
          ip += literal_length_length;
        }

        size_t avail = ip_limit_ - ip;
        while (avail < literal_length) {
          if (!writer->Append(ip, avail)) return;
          literal_length -= avail;
          reader_->Skip(peeked_);
          size_t n;
          ip = reader_->Peek(&n);
          avail = n;
          peeked_ = avail;
          if (avail == 0) return;  // Premature end of input
          ip_limit_ = ip + avail;
        }
        if (!writer->Append(ip, literal_length)) {
          return;
        }
        ip += literal_length;
        MAYBE_REFILL();
      } else {
        const uint32 entry = char_table[c];
        const uint32 trailer = LittleEndian::Load32(ip) & wordmask[entry >> 11];
        const uint32 length = entry & 0xff;
        ip += entry >> 11;

        // copy_offset/256 is encoded in bits 8..10.  By just fetching
        // those bits, we get copy_offset (since the bit-field starts at
        // bit 8).
        const uint32 copy_offset = entry & 0x700;
        if (!writer->AppendFromSelf(copy_offset + trailer, length)) {
          return;
        }
        MAYBE_REFILL();
      }
    }

#undef MAYBE_REFILL
  }